

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

UtxoData * __thiscall cfd::UtxoData::operator=(UtxoData *this,UtxoData *object)

{
  UtxoData *in_RSI;
  UtxoData *in_RDI;
  
  if (in_RDI != in_RSI) {
    in_RDI->block_height = in_RSI->block_height;
    core::BlockHash::operator=(&in_RDI->block_hash,&in_RSI->block_hash);
    core::Txid::operator=(&in_RDI->txid,&in_RSI->txid);
    in_RDI->vout = in_RSI->vout;
    core::Script::operator=(&in_RDI->locking_script,&in_RSI->locking_script);
    core::Script::operator=(&in_RDI->redeem_script,&in_RSI->redeem_script);
    core::Address::operator=(&in_RDI->address,&in_RSI->address);
    std::__cxx11::string::operator=((string *)&in_RDI->descriptor,(string *)&in_RSI->descriptor);
    (in_RDI->amount).amount_ = (in_RSI->amount).amount_;
    (in_RDI->amount).ignore_check_ = (in_RSI->amount).ignore_check_;
    in_RDI->address_type = in_RSI->address_type;
    in_RDI->binary_data = in_RSI->binary_data;
    core::ConfidentialAssetId::operator=(&in_RDI->asset,&in_RSI->asset);
    core::ElementsConfidentialAddress::operator=
              (&in_RDI->confidential_address,&in_RSI->confidential_address);
    core::BlindFactor::operator=(&in_RDI->asset_blind_factor,&in_RSI->asset_blind_factor);
    core::BlindFactor::operator=(&in_RDI->amount_blind_factor,&in_RSI->amount_blind_factor);
    core::ConfidentialValue::operator=(&in_RDI->value_commitment,&in_RSI->value_commitment);
    core::Script::operator=(&in_RDI->scriptsig_template,&in_RSI->scriptsig_template);
  }
  return in_RDI;
}

Assistant:

UtxoData& UtxoData::operator=(const UtxoData& object) & {
  if (this != &object) {
    block_height = object.block_height;
    block_hash = object.block_hash;
    txid = object.txid;
    vout = object.vout;
    locking_script = object.locking_script;
    redeem_script = object.redeem_script;
    address = object.address;
    descriptor = object.descriptor;
    amount = object.amount;
    address_type = object.address_type;
    binary_data = object.binary_data;
#ifndef CFD_DISABLE_ELEMENTS
    asset = object.asset;
    confidential_address = object.confidential_address;
    asset_blind_factor = object.asset_blind_factor;
    amount_blind_factor = object.amount_blind_factor;
    value_commitment = object.value_commitment;
#endif  // CFD_DISABLE_ELEMENTS
    scriptsig_template = object.scriptsig_template;
  }
  return *this;
}